

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O2

int ncnn::rnn_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                  float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                  float *weight_hc_int8_scales,Mat *hidden_state,Option *opt)

{
  undefined4 uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 auVar2 [16];
  uint _h;
  uint _w;
  int iVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined8 uVar30;
  int *piVar37;
  void *pvVar38;
  void *pvVar39;
  int iVar40;
  void *pvVar41;
  ulong uVar42;
  int iVar43;
  uint uVar44;
  long lVar45;
  uint uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  ulong uVar53;
  void *pvVar54;
  float absmax;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  Option opt_quant;
  Mat local_1c8;
  Mat local_178;
  Mat local_128;
  Mat local_d8;
  undefined8 local_88;
  undefined8 uStack_80;
  Option opt_quant_1;
  undefined3 uVar5;
  undefined2 uVar7;
  undefined4 uVar16;
  undefined3 uVar18;
  undefined2 uVar20;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined3 uVar33;
  undefined1 uVar34;
  undefined2 uVar35;
  undefined1 uVar36;
  
  uVar44 = bottom_blob->w;
  _h = bottom_blob->h;
  _w = top_blob->w;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128._20_8_ = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  Mat::create(&local_128,_w,4,opt->workspace_allocator);
  iVar51 = -100;
  if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    Mat::create(&local_178,uVar44,_h,1,1,opt->workspace_allocator);
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8._20_8_ = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    Mat::create(&local_d8,_h,4,1,opt->workspace_allocator);
    iVar51 = bottom_blob->w;
    sVar10 = bottom_blob->elemsize;
    pvVar41 = bottom_blob->data;
    uVar48 = 0;
    uVar53 = (ulong)uVar44;
    if ((int)uVar44 < 1) {
      uVar53 = uVar48;
    }
    uVar47 = 0;
    if (0 < (int)_h) {
      uVar47 = (ulong)_h;
    }
    for (; uVar48 != uVar47; uVar48 = uVar48 + 1) {
      fVar55 = 0.0;
      for (uVar49 = 0; uVar53 != uVar49; uVar49 = uVar49 + 1) {
        fVar56 = ABS(*(float *)((long)pvVar41 + uVar49 * 4));
        if (fVar55 <= fVar56) {
          fVar55 = fVar56;
        }
      }
      *(float *)((long)local_d8.data + uVar48 * 4) = 127.0 / fVar55;
      pvVar41 = (void *)((long)pvVar41 + (long)iVar51 * sVar10);
    }
    opt_quant.lightmode = opt->lightmode;
    opt_quant.use_shader_pack8 = opt->use_shader_pack8;
    opt_quant.use_subgroup_ops = opt->use_subgroup_ops;
    opt_quant.use_reserved_0 = opt->use_reserved_0;
    opt_quant.num_threads = opt->num_threads;
    uVar14 = opt->openmp_blocktime;
    uVar15 = opt->use_winograd_convolution;
    uVar17 = opt->use_sgemm_convolution;
    uVar19 = opt->use_int8_inference;
    uVar21 = opt->use_vulkan_compute;
    uVar20 = CONCAT11(uVar21,uVar19);
    uVar18 = CONCAT21(uVar20,uVar17);
    uVar16 = CONCAT31(uVar18,uVar15);
    auVar58[0] = opt->use_bf16_storage;
    auVar58[1] = opt->use_fp16_packed;
    auVar58[2] = opt->use_fp16_storage;
    auVar58[3] = opt->use_fp16_arithmetic;
    auVar58[4] = opt->use_int8_packed;
    auVar58[5] = opt->use_int8_storage;
    auVar58[6] = opt->use_int8_arithmetic;
    auVar58[7] = opt->use_packing_layout;
    auVar58._8_4_ = opt->vulkan_device_index;
    uVar3 = opt->use_reserved_1;
    uVar4 = opt->use_image_storage;
    uVar6 = opt->use_tensor_storage;
    uVar8 = opt->use_reserved_2;
    uVar7 = CONCAT11(uVar8,uVar6);
    uVar5 = CONCAT21(uVar7,uVar4);
    auVar58._12_4_ = CONCAT31(uVar5,uVar3);
    uVar22 = opt->flush_denormals;
    uVar23 = opt->use_local_pool_allocator;
    uVar25 = opt->use_shader_local_memory;
    uVar27 = opt->use_cooperative_matrix;
    uVar29 = opt->use_winograd23_convolution;
    uVar28 = CONCAT11(uVar29,uVar27);
    uVar26 = CONCAT21(uVar28,uVar25);
    uVar24 = CONCAT31(uVar26,uVar23);
    uVar30._0_1_ = opt->use_winograd43_convolution;
    uVar30._1_1_ = opt->use_winograd63_convolution;
    uVar30._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar30._3_1_ = opt->use_fp16_uniform;
    uVar31 = opt->use_int8_uniform;
    uVar32 = opt->use_reserved_9;
    uVar34 = opt->use_reserved_10;
    uVar36 = opt->use_reserved_11;
    uVar35 = CONCAT11(uVar36,uVar34);
    uVar33 = CONCAT21(uVar35,uVar32);
    uVar30._4_4_ = CONCAT31(uVar33,uVar31);
    opt_quant._56_4_ = SUB84(uVar30,0);
    opt_quant._32_7_ = auVar58._0_7_;
    opt_quant.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant.use_packing_layout = false;
    opt_quant.openmp_blocktime = uVar14;
    opt_quant._28_4_ = uVar16;
    opt_quant.vulkan_device_index = auVar58._8_4_;
    opt_quant._44_4_ = auVar58._12_4_;
    opt_quant.flush_denormals = uVar22;
    opt_quant._52_4_ = uVar24;
    opt_quant._60_4_ = uVar30._4_4_;
    quantize_to_int8(bottom_blob,&local_178,&local_d8,&opt_quant);
    opt_quant.lightmode = false;
    opt_quant.use_shader_pack8 = false;
    opt_quant.use_subgroup_ops = false;
    opt_quant.use_reserved_0 = false;
    opt_quant.num_threads = 0;
    opt_quant.blob_allocator._0_4_ = 0;
    opt_quant.blob_allocator._4_4_ = 0;
    opt_quant.workspace_allocator._0_4_ = 0;
    opt_quant.workspace_allocator._4_4_ = 0;
    opt_quant.openmp_blocktime = 0;
    opt_quant.use_bf16_storage = false;
    opt_quant.use_fp16_packed = false;
    opt_quant.use_fp16_storage = false;
    opt_quant.use_fp16_arithmetic = false;
    opt_quant.use_int8_packed = false;
    opt_quant.use_int8_storage = false;
    opt_quant.use_int8_arithmetic = false;
    opt_quant.use_packing_layout = false;
    opt_quant.vulkan_device_index = 0;
    opt_quant.use_reserved_1 = false;
    opt_quant.use_image_storage = false;
    opt_quant.use_tensor_storage = false;
    opt_quant.use_reserved_2 = false;
    opt_quant.flush_denormals = 0;
    opt_quant.use_local_pool_allocator = false;
    opt_quant.use_shader_local_memory = false;
    opt_quant.use_cooperative_matrix = false;
    opt_quant.use_winograd23_convolution = false;
    opt_quant.use_winograd43_convolution = false;
    opt_quant.use_winograd63_convolution = false;
    opt_quant.use_a53_a55_optimized_kernel = false;
    opt_quant.use_fp16_uniform = false;
    Mat::create((Mat *)&opt_quant,_w,1,1,opt->workspace_allocator);
    local_1c8.cstep = 0;
    local_1c8.data = (float *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8._20_8_ = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    Mat::create(&local_1c8,1,4,1,opt->workspace_allocator);
    uVar48 = 0;
    if (0 < (int)_w) {
      uVar48 = (ulong)_w;
    }
    for (uVar44 = 0; uVar44 != (uint)uVar47; uVar44 = uVar44 + 1) {
      fVar55 = 0.0;
      for (uVar49 = 0; uVar48 != uVar49; uVar49 = uVar49 + 1) {
        fVar56 = ABS(*(float *)((long)hidden_state->data + uVar49 * 4));
        if (fVar55 <= fVar56) {
          fVar55 = fVar56;
        }
      }
      uVar46 = ~uVar44 + _h;
      if (reverse == 0) {
        uVar46 = uVar44;
      }
      if (fVar55 == 0.0) {
        *(float *)local_1c8.data = 1.0;
        for (lVar45 = 0; lVar45 != 0; lVar45 = lVar45 + 1) {
          *(undefined1 *)(opt_quant._0_8_ + lVar45) = 0;
        }
      }
      else {
        *(float *)local_1c8.data = 127.0 / fVar55;
        opt_quant_1.lightmode = opt->lightmode;
        opt_quant_1.use_shader_pack8 = opt->use_shader_pack8;
        opt_quant_1.use_subgroup_ops = opt->use_subgroup_ops;
        opt_quant_1.use_reserved_0 = opt->use_reserved_0;
        opt_quant_1.num_threads = opt->num_threads;
        opt_quant_1.workspace_allocator = opt->workspace_allocator;
        opt_quant_1.openmp_blocktime = opt->openmp_blocktime;
        opt_quant_1.use_winograd_convolution = opt->use_winograd_convolution;
        opt_quant_1.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_quant_1.use_int8_inference = opt->use_int8_inference;
        opt_quant_1.use_vulkan_compute = opt->use_vulkan_compute;
        auVar2[0] = opt->use_bf16_storage;
        auVar2[1] = opt->use_fp16_packed;
        auVar2[2] = opt->use_fp16_storage;
        auVar2[3] = opt->use_fp16_arithmetic;
        auVar2[4] = opt->use_int8_packed;
        auVar2[5] = opt->use_int8_storage;
        auVar2[6] = opt->use_int8_arithmetic;
        auVar2[7] = opt->use_packing_layout;
        auVar2._8_4_ = opt->vulkan_device_index;
        auVar2[0xc] = opt->use_reserved_1;
        auVar2[0xd] = opt->use_image_storage;
        auVar2[0xe] = opt->use_tensor_storage;
        auVar2[0xf] = opt->use_reserved_2;
        opt_quant_1.flush_denormals = opt->flush_denormals;
        opt_quant_1.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_quant_1.use_shader_local_memory = opt->use_shader_local_memory;
        opt_quant_1.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_quant_1.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_quant_1.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_quant_1.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_quant_1.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_quant_1.use_fp16_uniform = opt->use_fp16_uniform;
        opt_quant_1.use_int8_uniform = opt->use_int8_uniform;
        opt_quant_1.use_reserved_9 = opt->use_reserved_9;
        opt_quant_1.use_reserved_10 = opt->use_reserved_10;
        opt_quant_1.use_reserved_11 = opt->use_reserved_11;
        opt_quant_1.blob_allocator = opt->workspace_allocator;
        opt_quant_1._32_7_ = auVar2._0_7_;
        opt_quant_1.use_packing_layout = false;
        opt_quant_1.vulkan_device_index = auVar2._8_4_;
        opt_quant_1.use_reserved_1 = (bool)auVar2[0xc];
        opt_quant_1.use_image_storage = (bool)auVar2[0xd];
        opt_quant_1.use_tensor_storage = (bool)auVar2[0xe];
        opt_quant_1.use_reserved_2 = (bool)auVar2[0xf];
        quantize_to_int8(hidden_state,(Mat *)&opt_quant,&local_1c8,&opt_quant_1);
      }
      pvVar39 = local_128.data;
      pvVar38 = local_178.data;
      uVar30 = opt_quant._0_8_;
      lVar52 = (long)local_178.w;
      lVar50 = (long)(int)uVar46;
      lVar45 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
      pvVar41 = weight_xc_int8->data;
      iVar51 = weight_xc_int8->w;
      pvVar54 = weight_hc_int8->data;
      iVar9 = weight_hc_int8->w;
      sVar10 = weight_hc_int8->elemsize;
      pvVar11 = bias_c->data;
      local_88 = CONCAT44(*(undefined4 *)((long)local_d8.data + lVar50 * 4),*local_1c8.data);
      uStack_80 = 0;
      sVar12 = weight_xc_int8->elemsize;
      for (uVar49 = 0; uVar49 != uVar48; uVar49 = uVar49 + 1) {
        iVar40 = 0;
        for (uVar42 = 0; uVar53 != uVar42; uVar42 = uVar42 + 1) {
          iVar40 = iVar40 + (int)*(char *)((long)pvVar38 + uVar42 + lVar52 * lVar50 * lVar45) *
                            (int)*(char *)((long)pvVar41 + uVar42);
        }
        iVar43 = 0;
        for (uVar42 = 0; _w != uVar42; uVar42 = uVar42 + 1) {
          iVar43 = iVar43 + (int)*(char *)(uVar30 + uVar42) * (int)*(char *)((long)pvVar54 + uVar42)
          ;
        }
        auVar57._0_4_ = (float)iVar43;
        auVar57._4_4_ = (float)iVar40;
        auVar57._8_8_ = 0;
        auVar13._4_4_ = weight_xc_int8_scales[uVar49] * local_88._4_4_;
        auVar13._0_4_ = weight_hc_int8_scales[uVar49] * (float)local_88;
        auVar13._8_4_ = (float)uStack_80 * 0.0;
        auVar13._12_4_ = uStack_80._4_4_ * 0.0;
        auVar58 = divps(auVar57,auVar13);
        fVar55 = tanhf(auVar58._4_4_ + auVar58._0_4_ + *(float *)((long)pvVar11 + uVar49 * 4));
        *(float *)((long)pvVar39 + uVar49 * 4) = fVar55;
        pvVar41 = (void *)((long)pvVar41 + (long)iVar51 * sVar12);
        pvVar54 = (void *)((long)pvVar54 + (long)iVar9 * sVar10);
      }
      iVar51 = top_blob->w;
      sVar10 = top_blob->elemsize;
      pvVar41 = top_blob->data;
      pvVar54 = hidden_state->data;
      for (uVar49 = 0; uVar48 != uVar49; uVar49 = uVar49 + 1) {
        uVar1 = *(undefined4 *)((long)local_128.data + uVar49 * 4);
        *(undefined4 *)((long)pvVar54 + uVar49 * 4) = uVar1;
        *(undefined4 *)((long)pvVar41 + uVar49 * 4 + iVar51 * lVar50 * sVar10) = uVar1;
      }
    }
    piVar37 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          free(local_1c8.data);
        }
        else {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar37 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if ((long *)CONCAT17(opt_quant.use_packing_layout,opt_quant._32_7_) == (long *)0x0) {
          free((void *)opt_quant._0_8_);
        }
        else {
          (**(code **)(*(long *)CONCAT17(opt_quant.use_packing_layout,opt_quant._32_7_) + 0x18))();
        }
      }
    }
    piVar37 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          free(local_d8.data);
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar37 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          free(local_178.data);
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar51 = 0;
  }
  piVar37 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar51;
}

Assistant:

static int rnn_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const signed char* weight_xc_int8_ptr = weight_xc_int8.row<const signed char>(q);
            const signed char* weight_hc_int8_ptr = weight_hc_int8.row<const signed char>(q);

            const float descale_xc = 1.f / weight_xc_int8_scales[q];
            const float descale_hc = 1.f / weight_hc_int8_scales[q];

            int Hx = 0;
            for (int i = 0; i < size; i++)
            {
                Hx += weight_xc_int8_ptr[i] * x[i];
            }

            int Hh = 0;
            for (int i = 0; i < num_output; i++)
            {
                Hh += weight_hc_int8_ptr[i] * hs[i];
            }

            float H = bias_c[q] + Hx * (descale_x * descale_xc) + Hh * (descale_h * descale_hc);

            H = tanhf(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}